

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_archive_match_path.c
# Opt level: O0

void test_exclusion_and_inclusion(void)

{
  wchar_t wVar1;
  wchar_t *local_28;
  wchar_t *wp;
  char *mp;
  archive *m;
  archive_entry *ae;
  
  mp = (char *)archive_match_new();
  wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                           ,L'ź',(uint)((archive *)mp != (archive *)0x0),
                           "(m = archive_match_new()) != NULL",(void *)0x0);
  if (wVar1 != L'\0') {
    m = (archive *)archive_entry_new();
    wVar1 = assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                             ,L'ż',(uint)((archive_entry *)m != (archive_entry *)0x0),
                             "(ae = archive_entry_new()) != NULL",(void *)0x0);
    if (wVar1 == L'\0') {
      archive_match_free((archive *)mp);
    }
    else {
      wVar1 = archive_match_exclude_pattern((archive *)mp,"^aaa*");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɓ',0,"0",(long)wVar1,"archive_match_exclude_pattern(m, \"^aaa*\")",mp)
      ;
      wVar1 = archive_match_include_pattern_w((archive *)mp,anon_var_dwarf_8047);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ƃ',0,"0",(long)wVar1,"archive_match_include_pattern_w(m, L\"^aa*\")",
                          mp);
      wVar1 = archive_match_include_pattern((archive *)mp,"^a1*");
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƃ',0,"0",(long)wVar1,"archive_match_include_pattern(m, \"^a1*\")",mp);
      archive_entry_copy_pathname((archive_entry *)m,"aa1234");
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƈ',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɖ',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear((archive_entry *)m);
      archive_entry_copy_pathname_w((archive_entry *)m,anon_var_dwarf_82a9 + 1);
      failure("\'aa1234\' should not be excluded");
      wVar1 = archive_match_path_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƍ',0,"0",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ǝ',0,"0",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_copy_pathname((archive_entry *)m,"aaa1234");
      failure("\'aaa1234\' should be excluded");
      wVar1 = archive_match_path_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɠ',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɣ',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      archive_entry_clear((archive_entry *)m);
      archive_entry_copy_pathname_w((archive_entry *)m,anon_var_dwarf_82a9);
      failure("\'aaa1234\' should be excluded");
      wVar1 = archive_match_path_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ƙ',1,"1",(long)wVar1,"archive_match_path_excluded(m, ae)",(void *)0x0)
      ;
      wVar1 = archive_match_excluded((archive *)mp,(archive_entry *)m);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƙ',1,"1",(long)wVar1,"archive_match_excluded(m, ae)",(void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions((archive *)mp);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɯ',1,"1",(long)wVar1,"archive_match_path_unmatched_inclusions(m)",
                          (void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions_next((archive *)mp,(char **)&wp);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ɵ',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next(m, &mp)",mp);
      assertion_equal_string
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                 ,L'Ơ',"^a1*","\"^a1*\"",(char *)wp,"mp",(void *)0x0,L'\0');
      wVar1 = archive_match_path_unmatched_inclusions_next((archive *)mp,(char **)&wp);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'Ƣ',1,"ARCHIVE_EOF",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next(m, &mp)",mp);
      wVar1 = archive_match_path_unmatched_inclusions_next_w((archive *)mp,&local_28);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƥ',0,"ARCHIVE_OK",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next_w(m, &wp)",mp);
      assertion_equal_wstring
                ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                 ,L'Ʀ',anon_var_dwarf_8310,"L\"^a1*\"",local_28,"wp",(void *)0x0);
      wVar1 = archive_match_path_unmatched_inclusions_next_w((archive *)mp,&local_28);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_archive_match_path.c"
                          ,L'ƨ',1,"ARCHIVE_EOF",(long)wVar1,
                          "archive_match_path_unmatched_inclusions_next_w(m, &wp)",mp);
      archive_entry_free((archive_entry *)m);
      archive_match_free((archive *)mp);
    }
  }
  return;
}

Assistant:

static void
test_exclusion_and_inclusion(void)
{
	struct archive_entry *ae;
	struct archive *m;
	const char *mp;
	const wchar_t *wp;

	if (!assert((m = archive_match_new()) != NULL))
		return;
	if (!assert((ae = archive_entry_new()) != NULL)) {
		archive_match_free(m);
		return;
	}

	assertEqualIntA(m, 0, archive_match_exclude_pattern(m, "^aaa*"));
	assertEqualIntA(m, 0, archive_match_include_pattern_w(m, L"^aa*"));
	assertEqualIntA(m, 0, archive_match_include_pattern(m, "^a1*"));

	/* Test with 'aa1234', which should not be excluded. */
	archive_entry_copy_pathname(ae, "aa1234");
	failure("'aa1234' should not be excluded");
	assertEqualInt(0, archive_match_path_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));
	archive_entry_clear(ae);
	archive_entry_copy_pathname_w(ae, L"aa1234");
	failure("'aa1234' should not be excluded");
	assertEqualInt(0, archive_match_path_excluded(m, ae));
	assertEqualInt(0, archive_match_excluded(m, ae));

	/* Test with 'aaa1234', which should be excluded. */
	archive_entry_copy_pathname(ae, "aaa1234");
	failure("'aaa1234' should be excluded");
	assertEqualInt(1, archive_match_path_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));
	archive_entry_clear(ae);
	archive_entry_copy_pathname_w(ae, L"aaa1234");
	failure("'aaa1234' should be excluded");
	assertEqualInt(1, archive_match_path_excluded(m, ae));
	assertEqualInt(1, archive_match_excluded(m, ae));

	/* Verify unmatched_inclusions. */
	assertEqualInt(1, archive_match_path_unmatched_inclusions(m));
	/* Verify unmatched inclusion patterns. */
	assertEqualIntA(m, ARCHIVE_OK,
	    archive_match_path_unmatched_inclusions_next(m, &mp));
	assertEqualString("^a1*", mp);
	assertEqualIntA(m, ARCHIVE_EOF,
	    archive_match_path_unmatched_inclusions_next(m, &mp));
	/* Verify unmatched inclusion patterns again in Wide-Char. */
	assertEqualIntA(m, ARCHIVE_OK,
	    archive_match_path_unmatched_inclusions_next_w(m, &wp));
	assertEqualWString(L"^a1*", wp);
	assertEqualIntA(m, ARCHIVE_EOF,
	    archive_match_path_unmatched_inclusions_next_w(m, &wp));

	/* Clean up. */
	archive_entry_free(ae);
	archive_match_free(m);
}